

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O0

int setsocketreuseaddr(SOCKET sock,BOOL reuseaddr)

{
  BOOL local_14;
  int iOptLen;
  int iOptVal;
  BOOL reuseaddr_local;
  SOCKET sock_local;
  
  local_14 = reuseaddr;
  iOptLen = reuseaddr;
  iOptVal = sock;
  setsockopt(sock,1,2,&local_14,4);
  return 0;
}

Assistant:

inline int setsocketreuseaddr(SOCKET sock, BOOL reuseaddr)
{
	int iOptVal = 0;
	int iOptLen = 0;

	iOptVal = (int)reuseaddr;
	iOptLen = sizeof(int);
	if (setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, (char*)&iOptVal, iOptLen) == SOCKET_ERROR) 
	{
		PRINT_DEBUG_WARNING_OSNET(("setsocketreuseaddr warning (%s) : %s(sock=%d, reuseaddr=%d)\n", 
			strtime_m(), 
			"setsockopt failed. ", 
			(int)sock, (int)reuseaddr));
		//return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}